

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::set_root_as_stream(Tree *this)

{
  ulong uVar1;
  NodeData *pNVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  bool bVar6;
  bool bVar7;
  size_t node;
  size_t sVar8;
  size_t node_00;
  size_t sVar9;
  size_t node_01;
  long lVar10;
  size_t after;
  NodeType_e f;
  char msg [31];
  char local_88 [28];
  undefined4 uStack_6c;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  node = root_id(this);
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = -0x7a;
    local_88[9] = 'K';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = -0x66;
    local_88[0x19] = -0x21;
    local_88[0x1a] = '\x1f';
    local_88[0x1b] = '\0';
    uStack_6c = 0;
    local_68 = 0x65;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  lVar10 = node * 0x90;
  if ((~(int)this->m_buf[node].m_type.type & 0x28U) == 0) {
    return;
  }
  bVar7 = has_children(this,node);
  bVar6 = this->m_cap <= node;
  if (bVar7) {
    if (bVar6 || node == 0xffffffffffffffff) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x7a;
      local_88[9] = 'K';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[node].m_type.type & KEY) != NOTYPE) {
      builtin_strncpy(local_88 + 0x10,"has_key(root",0xc);
      uStack_6c = CONCAT13(uStack_6c._3_1_,0x2929);
      builtin_strncpy(local_88,"check failed: (!",0x10);
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_58 = 0;
      uStack_50 = 0x6567;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar5 = ZEXT1224(ZEXT412(0x6567) << 0x40);
      LVar4.name.str._0_4_ = 0x1fdf9a;
      LVar4.super_LineCol.offset = auVar5._0_8_;
      LVar4.super_LineCol.line = auVar5._8_8_;
      LVar4.super_LineCol.col = auVar5._16_8_;
      LVar4.name.str._4_4_ = 0;
      LVar4.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_88,0x1f,LVar4,(this->m_callbacks).m_user_data);
    }
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x7d;
      local_88[9] = 'K';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar1 = this->m_buf[node].m_last_child;
    if (node == 0xffffffffffffffff) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x4f;
      local_88[9] = 'L';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x7a;
      local_88[9] = 'K';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (((this->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) &&
       (bVar6 = is_root(this,node), !bVar6)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x4e;
      local_88[9] = 'L';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (uVar1 != 0xffffffffffffffff) {
      if (this->m_cap <= uVar1) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7d;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (this->m_buf[uVar1].m_parent != node) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x4d;
        local_88[9] = 'L';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    local_60 = lVar10;
    sVar8 = _claim(this);
    _set_hierarchy(this,sVar8,node,uVar1);
    _copy_props_wo_key(this,sVar8,this,node);
    if ((sVar8 == 0xffffffffffffffff) || (this->m_cap <= sVar8)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x7d;
      local_88[9] = 'K';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar2 = this->m_buf;
    f = pNVar2[sVar8].m_type.type | DOC;
    _check_next_flags(this,sVar8,f);
    pNVar2[sVar8].m_type.type = f;
    node_00 = first_child(this,node);
    sVar9 = next_sibling(this,node_00);
    if (node_00 != sVar8 && node_00 != 0xffffffffffffffff) {
      after = 0xffffffffffffffff;
      do {
        node_01 = sVar9;
        move(this,node_00,sVar8,after);
        sVar9 = next_sibling(this,node_01);
        if (node_01 == 0xffffffffffffffff) break;
        after = node_00;
        node_00 = node_01;
      } while (node_01 != sVar8);
    }
    lVar10 = local_60;
    if ((node != 0xffffffffffffffff) && (node < this->m_cap)) goto LAB_001c29f0;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  else {
    if (bVar6 || node == 0xffffffffffffffff) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = -0x7a;
      local_88[9] = 'K';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = -0x66;
      local_88[0x19] = -0x21;
      local_88[0x1a] = '\x1f';
      local_88[0x1b] = '\0';
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[node].m_type.type & KEYVAL) == VAL) {
      if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7d;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[node].m_type.type = this->m_buf[node].m_type.type | SEQ;
      if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7d;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      uVar1 = this->m_buf[node].m_last_child;
      if (node == 0xffffffffffffffff) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x4f;
        local_88[9] = 'L';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      }
      if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7a;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (((this->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) &&
         (bVar6 = is_root(this,node), !bVar6)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x4e;
        local_88[9] = 'L';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (uVar1 != 0xffffffffffffffff) {
        if (this->m_cap <= uVar1) {
          if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          local_88[8] = -0x7d;
          local_88[9] = 'K';
          local_88[10] = '\0';
          local_88[0xb] = '\0';
          local_88[0xc] = '\0';
          local_88[0xd] = '\0';
          local_88[0xe] = '\0';
          local_88[0xf] = '\0';
          local_88[0x10] = '\0';
          local_88[0x11] = '\0';
          local_88[0x12] = '\0';
          local_88[0x13] = '\0';
          local_88[0x14] = '\0';
          local_88[0x15] = '\0';
          local_88[0x16] = '\0';
          local_88[0x17] = '\0';
          local_88[0x18] = -0x66;
          local_88[0x19] = -0x21;
          local_88[0x1a] = '\x1f';
          local_88[0x1b] = '\0';
          uStack_6c = 0;
          local_68 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (this->m_buf[uVar1].m_parent != node) {
          if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          local_88[8] = -0x4d;
          local_88[9] = 'L';
          local_88[10] = '\0';
          local_88[0xb] = '\0';
          local_88[0xc] = '\0';
          local_88[0xd] = '\0';
          local_88[0xe] = '\0';
          local_88[0xf] = '\0';
          local_88[0x10] = '\0';
          local_88[0x11] = '\0';
          local_88[0x12] = '\0';
          local_88[0x13] = '\0';
          local_88[0x14] = '\0';
          local_88[0x15] = '\0';
          local_88[0x16] = '\0';
          local_88[0x17] = '\0';
          local_88[0x18] = -0x66;
          local_88[0x19] = -0x21;
          local_88[0x1a] = '\x1f';
          local_88[0x1b] = '\0';
          uStack_6c = 0;
          local_68 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      sVar8 = _claim(this);
      _set_hierarchy(this,sVar8,node,uVar1);
      _copy_props_wo_key(this,sVar8,this,node);
      if ((sVar8 == 0xffffffffffffffff) || (this->m_cap <= sVar8)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7d;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[sVar8].m_type.type = this->m_buf[sVar8].m_type.type | DOC;
      if ((sVar8 == 0xffffffffffffffff) || (this->m_cap <= sVar8)) {
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = -0x7d;
        local_88[9] = 'K';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_88[0x18] = -0x66;
        local_88[0x19] = -0x21;
        local_88[0x1a] = '\x1f';
        local_88[0x1b] = '\0';
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[sVar8].m_type.type = this->m_buf[sVar8].m_type.type & ~SEQ;
    }
    if ((node != 0xffffffffffffffff) && (node < this->m_cap)) goto LAB_001c29f0;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = -0x7d;
  local_88[9] = 'K';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = -0x66;
  local_88[0x19] = -0x21;
  local_88[0x1a] = '\x1f';
  local_88[0x1b] = '\0';
  uStack_6c = 0;
  local_68 = 0x65;
  (*(code *)PTR_error_impl_00240518)
            ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
             (anonymous_namespace)::s_default_callbacks);
LAB_001c29f0:
  *(undefined8 *)((long)&(this->m_buf->m_type).type + lVar10) = 0x28;
  return;
}

Assistant:

void Tree::set_root_as_stream()
{
    size_t root = root_id();
    if(is_stream(root))
        return;
    // don't use _add_flags() because it's checked and will fail
    if(!has_children(root))
    {
        if(is_val(root))
        {
            _p(root)->m_type.add(SEQ);
            size_t next_doc = append_child(root);
            _copy_props_wo_key(next_doc, root);
            _p(next_doc)->m_type.add(DOC);
            _p(next_doc)->m_type.rem(SEQ);
        }
        _p(root)->m_type = STREAM;
        return;
    }
    _RYML_CB_ASSERT(m_callbacks, !has_key(root));
    size_t next_doc = append_child(root);
    _copy_props_wo_key(next_doc, root);
    _add_flags(next_doc, DOC);
    for(size_t prev = NONE, ch = first_child(root), next = next_sibling(ch); ch != NONE; )
    {
        if(ch == next_doc)
            break;
        move(ch, next_doc, prev);
        prev = ch;
        ch = next;
        next = next_sibling(next);
    }
    _p(root)->m_type = STREAM;
}